

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

iterator __thiscall
prevector<8U,_int,_unsigned_int,_int>::insert
          (prevector<8U,_int,_unsigned_int,_int> *this,iterator pos,int *value)

{
  int *__src;
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  prevector<8U,_int,_unsigned_int,_int> *ppVar5;
  int iVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->_size;
  uVar3 = uVar1 - 9;
  ppVar5 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  uVar4 = (this->_union).indirect_contents.capacity;
  if (uVar1 < 9) {
    uVar3 = uVar1;
    uVar4 = 8;
  }
  uVar3 = uVar3 + 1;
  if (uVar4 < uVar3) {
    change_capacity(this,(uVar3 >> 1) + uVar3);
  }
  if (uVar1 < 9) {
    ppVar5 = this;
  }
  uVar1 = this->_size;
  iVar6 = (int)((ulong)((long)pos.ptr - (long)ppVar5) >> 2);
  ppVar5 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  if (uVar1 < 9) {
    ppVar5 = this;
  }
  __src = (int *)((long)&ppVar5->_union + (long)iVar6 * 4);
  uVar4 = uVar1 - 9;
  if (uVar1 < 9) {
    uVar4 = uVar1;
  }
  memmove((ppVar5->_union).direct + (long)iVar6 * 4 + 4,__src,(ulong)(uVar4 - iVar6) << 2);
  this->_size = this->_size + 1;
  *(int *)((ppVar5->_union).direct + (long)iVar6 * 4 + 4 + -4) = *value;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (iterator)__src;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(iterator pos, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        memmove(ptr + 1, ptr, (size() - p) * sizeof(T));
        _size++;
        new(static_cast<void*>(ptr)) T(value);
        return iterator(ptr);
    }